

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ThreadSafeArena::~ThreadSafeArena(ThreadSafeArena *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  Memory mem;
  size_t space_allocated;
  size_t local_28;
  GetDeallocator local_20;
  
  CleanupList(this);
  local_28 = 0;
  mem = Free(this,&local_28);
  uVar1 = *(ulong *)(this + 8);
  uVar3 = uVar1 & 0xfffffffffffffff8;
  if (uVar3 == 0) {
    puVar2 = (undefined8 *)0x0;
    if ((uVar1 & 1) != 0) goto LAB_002b6746;
    local_20.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
  }
  else {
    puVar2 = *(undefined8 **)(uVar3 + 0x20);
    if ((uVar1 & 1) != 0) {
LAB_002b6746:
      local_28 = local_28 + mem.size;
      goto LAB_002b674a;
    }
    local_20.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar3 + 0x18);
  }
  local_20.space_allocated_ = &local_28;
  GetDeallocator::operator()(&local_20,mem);
LAB_002b674a:
  if (puVar2 != (undefined8 *)0x0) {
    (**(code **)*puVar2)(puVar2,local_28);
  }
  return;
}

Assistant:

ThreadSafeArena::~ThreadSafeArena() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();

  size_t space_allocated = 0;
  auto mem = Free(&space_allocated);

  // Policy is about to get deleted.
  auto* p = alloc_policy_.get();
  ArenaMetricsCollector* collector = p ? p->metrics_collector : nullptr;

  if (alloc_policy_.is_user_owned_initial_block()) {
    space_allocated += mem.size;
  } else {
    GetDeallocator(alloc_policy_.get(), &space_allocated)(mem);
  }

  if (collector) collector->OnDestroy(space_allocated);
}